

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

HashKeyData * __thiscall
cfd::js::api::json::HashKeyData::GetTypeString_abi_cxx11_(HashKeyData *this,HashKeyData *obj)

{
  HashKeyData *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->type_);
  return this;
}

Assistant:

static std::string GetTypeString(  // line separate
      const HashKeyData& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.type_);
  }